

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

void __thiscall BasePort::~BasePort(BasePort *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

BasePort::~BasePort()
{
    delete [] ReadBufferBroadcast;
    delete [] WriteBufferBroadcast;
    delete [] GenericBuffer;
}